

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O1

void chrono::Transform_Cq_to_Cqw
               (ChConstraintMatrixX7 *mCq,ChConstraintMatrixX6 *mCqw,ChBodyFrame *mbody)

{
  undefined1 auVar1 [16];
  long lVar2;
  long lVar3;
  bool bVar4;
  undefined8 *puVar5;
  double *pdVar6;
  Index row;
  long lVar7;
  double *pdVar8;
  Index inner;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ChGlMatrix34<double> mGl;
  undefined8 local_a0;
  double local_98;
  double local_90;
  undefined1 local_88 [16];
  undefined8 local_78;
  double local_70;
  double local_68;
  undefined8 local_60;
  double local_58;
  undefined8 local_50;
  double local_48;
  
  puVar5 = &local_a0;
  lVar2 = (mCq->super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>).m_storage.m_rows;
  if (lVar2 < 0) {
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                  "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, 7, 1, 7, 7>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, 7, 1, 7, 7>>, Level = 0]"
                 );
  }
  lVar3 = (mCqw->super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_1,_7,_6>_>).m_storage.m_rows;
  if (lVar3 < lVar2) {
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 6, 1, 7, 6>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 6, 1, 7, 6>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                 );
  }
  if (lVar2 != 0) {
    lVar7 = 0;
    pdVar6 = (double *)mCqw;
    pdVar8 = (double *)mCq;
    do {
      lVar9 = 0;
      do {
        pdVar6[lVar9] = pdVar8[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      lVar7 = lVar7 + 1;
      pdVar8 = pdVar8 + 7;
      pdVar6 = pdVar6 + 6;
    } while (lVar7 != lVar2);
  }
  local_98 = (mbody->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[0];
  local_68 = (mbody->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[1];
  local_98 = local_98 + local_98;
  local_68 = local_68 + local_68;
  local_58 = (mbody->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[2];
  local_58 = local_58 + local_58;
  local_90 = (mbody->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot.m_data[3];
  local_90 = local_90 + local_90;
  auVar15._0_8_ = -local_68;
  auVar15._8_8_ = 0x8000000000000000;
  local_a0 = vmovlpd_avx(auVar15);
  auVar16._8_8_ = local_58;
  auVar16._0_8_ = local_58;
  auVar12._8_8_ = 0x8000000000000000;
  auVar12._0_8_ = 0x8000000000000000;
  local_88 = vxorpd_avx512vl(auVar16,auVar12);
  auVar14._0_8_ = -local_90;
  auVar14._8_8_ = 0x8000000000000000;
  local_78 = vmovlpd_avx(auVar14);
  local_70 = local_98;
  local_60 = vmovlpd_avx(auVar14);
  local_50 = vmovlpd_avx(auVar15);
  local_48 = local_98;
  lVar7 = 1;
  if (1 < lVar2) {
    lVar7 = lVar2;
  }
  lVar9 = 0;
  do {
    if (lVar2 != 0) {
      lVar10 = 0;
      pdVar6 = (mCq->super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>).m_storage.m_data
               .array + 3;
      bVar4 = lVar2 != 0;
      do {
        if (!bVar4) {
          __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x77,
                        "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 7, 1, 7, 7>, 0>::operator()(Index, Index) const [Derived = Eigen::Matrix<double, -1, 7, 1, 7, 7>, Level = 0]"
                       );
        }
        auVar12 = ZEXT816(0) << 0x40;
        lVar11 = 0;
        do {
          auVar13._8_8_ = 0;
          auVar13._0_8_ = pdVar6[lVar11];
          auVar1._8_8_ = 0;
          auVar1._0_8_ = *(ulong *)((long)puVar5 + lVar11 * 8);
          auVar12 = vfmadd231sd_fma(auVar12,auVar13,auVar1);
          lVar11 = lVar11 + 1;
        } while (lVar11 != 4);
        if (lVar3 <= lVar10) {
          __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 6, 1, 7, 6>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, 6, 1, 7, 6>, Level = 1]"
                       );
        }
        (mCqw->super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_1,_7,_6>_>).m_storage.m_data.array
        [lVar9 + lVar10 * 6 + 3] = auVar12._0_8_ * 0.25;
        lVar10 = lVar10 + 1;
        bVar4 = lVar10 < lVar2;
        pdVar6 = pdVar6 + 7;
      } while (lVar10 != lVar7);
    }
    lVar9 = lVar9 + 1;
    puVar5 = (undefined8 *)((long)puVar5 + 0x20);
    if (lVar9 == 3) {
      return;
    }
  } while( true );
}

Assistant:

static void Transform_Cq_to_Cqw(const ChLinkLock::ChConstraintMatrixX7& mCq,
                                ChLinkLock::ChConstraintMatrixX6& mCqw,
                                ChBodyFrame* mbody) {
    // translational part - not changed
    mCqw.block(0, 0, mCq.rows(), 3) = mCq.block(0, 0, mCq.rows(), 3);

    // rotational part [Cq_w] = [Cq_q]*[Gl]'*1/4
    ChGlMatrix34<> mGl(mbody->GetCoord().rot);
    for (int colres = 0; colres < 3; colres++) {
        for (int row = 0; row < mCq.rows(); row++) {
            double sum = 0;
            for (int col = 0; col < 4; col++) {
                sum += mCq(row, col + 3) * mGl(colres, col);
            }
            mCqw(row, colres + 3) = sum * 0.25;
        }
    }
    //// RADU: explicit loop slightly more performant than Eigen expressions
    ////mCqw.block(0, 3, mCq.rows(), 3) = 0.25 * mCq.block(0, 3, mCq.rows(), 4) * mGl.transpose();
}